

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThan,false,true,false,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  long lVar4;
  sel_t sVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int64_t *piVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  interval_t *input;
  
  if (count + 0x3f < 0x40) {
    lVar10 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    lVar10 = 0;
    uVar6 = 0;
    uVar16 = 0;
    do {
      uVar12 = uVar6;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar14 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar14 = count;
        }
LAB_0042db10:
        if (uVar6 < uVar14) {
          lVar8 = rdata->micros;
          psVar2 = sel->sel_vector;
          lVar9 = (long)rdata->days + lVar8 / 86400000000;
          lVar4 = lVar9 % 0x1e;
          lVar9 = (long)rdata->months + lVar9 / 0x1e;
          psVar3 = false_sel->sel_vector;
          piVar13 = &ldata[uVar6].micros;
          do {
            uVar12 = uVar6;
            if (psVar2 != (sel_t *)0x0) {
              uVar12 = (ulong)psVar2[uVar6];
            }
            lVar7 = (long)*(int32_t *)((long)piVar13 + -4) + *piVar13 / 86400000000;
            lVar17 = lVar7 % 0x1e;
            lVar7 = (long)((interval_t *)(piVar13 + -1))->months + lVar7 / 0x1e;
            if (lVar9 < lVar7) {
LAB_0042dc1f:
              uVar11 = 0;
            }
            else {
              uVar11 = 1;
              if (lVar9 <= lVar7) {
                if (lVar4 < lVar17) goto LAB_0042dc1f;
                uVar11 = (ulong)(*piVar13 % 86400000000 <= lVar8 % 86400000000 || lVar17 < lVar4);
              }
            }
            psVar3[lVar10] = (sel_t)uVar12;
            lVar10 = uVar11 + lVar10;
            uVar6 = uVar6 + 1;
            piVar13 = piVar13 + 2;
            uVar12 = uVar14;
          } while (uVar14 != uVar6);
        }
      }
      else {
        uVar11 = puVar1[uVar16];
        uVar14 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar14 = count;
        }
        if (uVar11 == 0xffffffffffffffff) goto LAB_0042db10;
        if (uVar11 == 0) {
          uVar12 = uVar14;
          if (uVar6 < uVar14) {
            psVar2 = sel->sel_vector;
            psVar3 = false_sel->sel_vector;
            do {
              sVar5 = (sel_t)uVar6;
              if (psVar2 != (sel_t *)0x0) {
                sVar5 = psVar2[uVar6];
              }
              psVar3[lVar10] = sVar5;
              lVar10 = lVar10 + 1;
              uVar6 = uVar6 + 1;
            } while (uVar14 != uVar6);
          }
        }
        else if (uVar6 < uVar14) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          piVar13 = &ldata[uVar6].micros;
          uVar15 = 0;
          do {
            if (psVar2 == (sel_t *)0x0) {
              sVar5 = (int)uVar6 + (int)uVar15;
            }
            else {
              sVar5 = psVar2[uVar6 + uVar15];
            }
            uVar12 = 1;
            if ((uVar11 >> (uVar15 & 0x3f) & 1) != 0) {
              lVar8 = (long)*(int32_t *)((long)piVar13 + -4) + *piVar13 / 86400000000;
              lVar4 = lVar8 % 0x1e;
              lVar17 = (long)((interval_t *)(piVar13 + -1))->months + lVar8 / 0x1e;
              lVar9 = (long)rdata->days + rdata->micros / 86400000000;
              lVar8 = lVar9 % 0x1e;
              lVar9 = (long)rdata->months + lVar9 / 0x1e;
              if (lVar9 < lVar17) {
                uVar12 = 0;
              }
              else if (lVar9 <= lVar17) {
                if (lVar8 < lVar4) {
                  uVar12 = 0;
                }
                else {
                  uVar12 = (ulong)(*piVar13 % 86400000000 <= rdata->micros % 86400000000 ||
                                  lVar4 < lVar8);
                }
              }
            }
            psVar3[lVar10] = sVar5;
            lVar10 = uVar12 + lVar10;
            uVar15 = uVar15 + 1;
            piVar13 = piVar13 + 2;
            uVar12 = uVar14;
          } while (uVar14 - uVar6 != uVar15);
        }
      }
      uVar6 = uVar12;
      uVar16 = uVar16 + 1;
    } while (uVar16 != count + 0x3f >> 6);
  }
  return count - lVar10;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}